

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.h
# Opt level: O1

int __thiscall QDate::daysInMonth(QDate *this)

{
  int iVar1;
  YearMonthDay YVar2;
  
  if ((this->jd + 0xb69eeff91fU < 0x16d3e147974) &&
     (YVar2 = QGregorianCalendar::partsFromJulian(this->jd), YVar2._0_8_ >> 0x20 != 0x80000000)) {
    iVar1 = QGregorianCalendar::monthLength(YVar2.month,YVar2.year);
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

constexpr bool isValid() const { return jd >= minJd() && jd <= maxJd(); }